

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O0

void __thiscall InputInterfaceToStream::~InputInterfaceToStream(InputInterfaceToStream *this)

{
  InputInterfaceToStream *this_local;
  
  (this->super_IByteReader)._vptr_IByteReader = (_func_int **)&PTR__InputInterfaceToStream_0054cc48;
  (this->super_IReadPositionProvider)._vptr_IReadPositionProvider =
       (_func_int **)&PTR__InputInterfaceToStream_0054cc80;
  std::__cxx11::string::~string((string *)&this->mInput);
  IReadPositionProvider::~IReadPositionProvider(&this->super_IReadPositionProvider);
  IByteReader::~IByteReader(&this->super_IByteReader);
  return;
}

Assistant:

virtual ~InputInterfaceToStream(){}